

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O2

void __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
::set_card_paging(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
                  *this)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  CardState previous_state;
  
  previous_state = this->card_state_;
  bVar2 = (this->switches_).internal_CX_rom;
  (this->card_state_).region_C4_C8 = bVar2;
  (this->card_state_).region_C1_C3 = bVar2;
  if ((bVar2 != false) || (bVar3 = true, (this->switches_).slot_C3_rom == true)) {
    bVar3 = bVar2;
  }
  (this->card_state_).region_C3 = bVar3;
  if (bVar2 == false) {
    uVar1 = (this->switches_).internal_C8_rom;
  }
  else {
    uVar1 = true;
  }
  (this->card_state_).region_C8_D0 = (bool)uVar1;
  bVar2 = CardState::operator!=(&previous_state,&this->card_state_);
  if (bVar2) {
    ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::set_paging<4>
              (this->machine_);
  }
  return;
}

Assistant:

void set_card_paging() {
			const auto previous_state = card_state_;

			// By default apply the CX switch through to $C7FF.
			card_state_.region_C1_C3 = card_state_.region_C4_C8 = switches_.internal_CX_rom;

			// Allow the C3 region to be switched to internal ROM in isolation even if the rest of the
			// first half of the CX region is diabled, if its specific switch is also disabled.
			if(!switches_.internal_CX_rom && !switches_.slot_C3_rom) {
				card_state_.region_C3 = true;
			} else {
				card_state_.region_C3 = card_state_.region_C1_C3;
			}

			// Apply the CX switch to $C800+, but also allow the C8 switch to select that region in isolation.
			card_state_.region_C8_D0 = switches_.internal_CX_rom || switches_.internal_C8_rom;

			if(previous_state != card_state_) {
				machine_.template set_paging<PagingType::CardArea>();
			}
		}